

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::util_ParseByteUnits::test_method(util_ParseByteUnits *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  _Storage<unsigned_long,_true> *p_Var3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  optional<unsigned_long> oVar5;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  char **ppcVar6;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  _Storage<unsigned_long,_true> local_50;
  undefined8 local_48;
  shared_count sStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x6ba;
  file.m_begin = (iterator)&local_60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = (char **)0xc694e1;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_98 = "";
  str._M_str = "1";
  str._M_len = 1;
  oVar5 = ParseByteUnits(str,NOOP);
  local_50._M_value =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  bVar1 = oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged;
  local_48._0_1_ = bVar1;
  if (((undefined1  [16])
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    ppcVar6 = &local_2b0;
    local_2b0 = (char *)CONCAT44(local_2b0._4_4_,1);
    pvVar2 = (iterator)0x2;
    p_Var3 = &local_50;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_90,&local_a0,0x6ba,1,2,p_Var3,"ParseByteUnits(\"1\", noop).value()",ppcVar6,
               "1");
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)p_Var3;
    msg_00.m_begin = pvVar2;
    file_00.m_end = (iterator)0x6bb;
    file_00.m_begin = (iterator)&local_b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c0,
               msg_00);
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = (char **)0xc694e1;
    local_d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_c8 = "";
    str_00._M_str = "0";
    str_00._M_len = 1;
    oVar5 = ParseByteUnits(str_00,NOOP);
    local_50._M_value =
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_48._0_1_ =
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    if (((undefined1  [16])
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_2b0 = (char *)((ulong)local_2b0 & 0xffffffff00000000);
      pvVar2 = (iterator)0x2;
      p_Var3 = &local_50;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                (&local_90,&local_d0,0x6bb,1,2,p_Var3,"ParseByteUnits(\"0\", noop).value()",ppcVar6,
                 "0");
      local_e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_d8 = "";
      local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_01.m_end = (iterator)p_Var3;
      msg_01.m_begin = pvVar2;
      file_01.m_end = (iterator)0x6bd;
      file_01.m_begin = (iterator)&local_e0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_f0,
                 msg_01);
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = (char **)0xc694e1;
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_f8 = "";
      str_01._M_str = "1k";
      str_01._M_len = 2;
      oVar5 = ParseByteUnits(str_01,NOOP);
      local_50._M_value =
           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      local_48._0_1_ =
           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
      if (((undefined1  [16])
           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        local_2b0 = (char *)0x3e8;
        pvVar2 = (iterator)0x2;
        p_Var3 = &local_50;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                  (&local_90,&local_100,0x6bd,1,2,p_Var3,"ParseByteUnits(\"1k\", noop).value()",
                   ppcVar6,"1000ULL");
        local_110 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_108 = "";
        local_120 = &boost::unit_test::basic_cstring<char_const>::null;
        local_118 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_02.m_end = (iterator)p_Var3;
        msg_02.m_begin = pvVar2;
        file_02.m_end = (iterator)0x6be;
        file_02.m_begin = (iterator)&local_110;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_120
                   ,msg_02);
        local_90.m_empty = false;
        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
        local_80 = boost::unit_test::lazy_ostream::inst;
        local_78 = (char **)0xc694e1;
        local_130 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_128 = "";
        str_02._M_str = "1K";
        str_02._M_len = 2;
        oVar5 = ParseByteUnits(str_02,NOOP);
        local_50._M_value =
             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        local_48._0_1_ =
             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
        if (((undefined1  [16])
             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          local_2b0 = (char *)0x400;
          pvVar2 = (iterator)0x2;
          p_Var3 = &local_50;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                    (&local_90,&local_130,0x6be,1,2,p_Var3,"ParseByteUnits(\"1K\", noop).value()",
                     ppcVar6,"1ULL << 10");
          local_140 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_138 = "";
          local_150 = &boost::unit_test::basic_cstring<char_const>::null;
          local_148 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_03.m_end = (iterator)p_Var3;
          msg_03.m_begin = pvVar2;
          file_03.m_end = (iterator)0x6c0;
          file_03.m_begin = (iterator)&local_140;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_150,msg_03);
          local_90.m_empty = false;
          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
          local_80 = boost::unit_test::lazy_ostream::inst;
          local_78 = (char **)0xc694e1;
          local_160 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_158 = "";
          str_03._M_str = "2m";
          str_03._M_len = 2;
          oVar5 = ParseByteUnits(str_03,NOOP);
          local_50._M_value =
               oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          local_48._0_1_ =
               oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
          if (((undefined1  [16])
               oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            local_2b0 = " \x01";
            pvVar2 = (iterator)0x2;
            p_Var3 = &local_50;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                      (&local_90,&local_160,0x6c0,1,2,p_Var3,"ParseByteUnits(\"2m\", noop).value()",
                       ppcVar6,"2\'000\'000ULL");
            local_170 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_168 = "";
            local_180 = &boost::unit_test::basic_cstring<char_const>::null;
            local_178 = &boost::unit_test::basic_cstring<char_const>::null;
            msg_04.m_end = (iterator)p_Var3;
            msg_04.m_begin = pvVar2;
            file_04.m_end = (iterator)0x6c1;
            file_04.m_begin = (iterator)&local_170;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                       (size_t)&local_180,msg_04);
            local_90.m_empty = false;
            local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
            local_80 = boost::unit_test::lazy_ostream::inst;
            local_78 = (char **)0xc694e1;
            local_190 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_188 = "";
            str_04._M_str = "2M";
            str_04._M_len = 2;
            oVar5 = ParseByteUnits(str_04,NOOP);
            local_50._M_value =
                 oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
            local_48._0_1_ =
                 oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_engaged;
            if (((undefined1  [16])
                 oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              local_2b0 = (char *)0x200000;
              pvVar2 = (iterator)0x2;
              p_Var3 = &local_50;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                        (&local_90,&local_190,0x6c1,1,2,p_Var3,
                         "ParseByteUnits(\"2M\", noop).value()",ppcVar6,"2ULL << 20");
              local_1a0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
              ;
              local_198 = "";
              local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
              msg_05.m_end = (iterator)p_Var3;
              msg_05.m_begin = pvVar2;
              file_05.m_end = (iterator)0x6c3;
              file_05.m_begin = (iterator)&local_1a0;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                         (size_t)&local_1b0,msg_05);
              local_90.m_empty = false;
              local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
              local_80 = boost::unit_test::lazy_ostream::inst;
              local_78 = (char **)0xc694e1;
              local_1c0 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
              ;
              local_1b8 = "";
              str_05._M_str = "3g";
              str_05._M_len = 2;
              oVar5 = ParseByteUnits(str_05,NOOP);
              local_50._M_value =
                   oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload;
              local_48._0_1_ =
                   oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_engaged;
              if (((undefined1  [16])
                   oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                local_2b0 = (char *)0xb2d05e00;
                pvVar2 = (iterator)0x2;
                p_Var3 = &local_50;
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                          (&local_90,&local_1c0,0x6c3,1,2,p_Var3,
                           "ParseByteUnits(\"3g\", noop).value()",ppcVar6,"3\'000\'000\'000ULL");
                local_1d0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                ;
                local_1c8 = "";
                local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
                msg_06.m_end = (iterator)p_Var3;
                msg_06.m_begin = pvVar2;
                file_06.m_end = (iterator)0x6c4;
                file_06.m_begin = (iterator)&local_1d0;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                           (size_t)&local_1e0,msg_06);
                local_90.m_empty = false;
                local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
                local_80 = boost::unit_test::lazy_ostream::inst;
                local_78 = (char **)0xc694e1;
                local_1f0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                ;
                local_1e8 = "";
                str_06._M_str = "3G";
                str_06._M_len = 2;
                oVar5 = ParseByteUnits(str_06,NOOP);
                local_50._M_value =
                     oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload;
                local_48._0_1_ =
                     oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_engaged;
                if (((undefined1  [16])
                     oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    std::__throw_bad_optional_access();
                  }
                }
                else {
                  local_2b0 = (char *)0xc0000000;
                  pvVar2 = (iterator)0x2;
                  p_Var3 = &local_50;
                  boost::test_tools::tt_detail::
                  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                            (&local_90,&local_1f0,0x6c4,1,2,p_Var3,
                             "ParseByteUnits(\"3G\", noop).value()",ppcVar6,"3ULL << 30");
                  local_200 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                  ;
                  local_1f8 = "";
                  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
                  msg_07.m_end = (iterator)p_Var3;
                  msg_07.m_begin = pvVar2;
                  file_07.m_end = (iterator)0x6c6;
                  file_07.m_begin = (iterator)&local_200;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                             (size_t)&local_210,msg_07);
                  local_90.m_empty = false;
                  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
                  local_80 = boost::unit_test::lazy_ostream::inst;
                  local_78 = (char **)0xc694e1;
                  local_220 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                  ;
                  local_218 = "";
                  str_07._M_str = "4t";
                  str_07._M_len = 2;
                  oVar5 = ParseByteUnits(str_07,NOOP);
                  local_50._M_value =
                       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_payload;
                  local_48._0_1_ =
                       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_engaged;
                  if (((undefined1  [16])
                       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_bad_optional_access();
                    }
                  }
                  else {
                    local_2b0 = (char *)0x3a352944000;
                    pvVar2 = (iterator)0x2;
                    p_Var3 = &local_50;
                    boost::test_tools::tt_detail::
                    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                              (&local_90,&local_220,0x6c6,1,2,p_Var3,
                               "ParseByteUnits(\"4t\", noop).value()",ppcVar6,
                               "4\'000\'000\'000\'000ULL");
                    local_230 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                    ;
                    local_228 = "";
                    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
                    msg_08.m_end = (iterator)p_Var3;
                    msg_08.m_begin = pvVar2;
                    file_08.m_end = (iterator)0x6c7;
                    file_08.m_begin = (iterator)&local_230;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                               (size_t)&local_240,msg_08);
                    local_90.m_empty = false;
                    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
                    local_80 = boost::unit_test::lazy_ostream::inst;
                    local_78 = (char **)0xc694e1;
                    local_250 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                    ;
                    local_248 = "";
                    str_08._M_str = "4T";
                    str_08._M_len = 2;
                    oVar5 = ParseByteUnits(str_08,NOOP);
                    local_50._M_value =
                         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long>._M_payload;
                    local_48._0_1_ =
                         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long>._M_engaged;
                    if (((undefined1  [16])
                         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                        (undefined1  [16])0x0) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        std::__throw_bad_optional_access();
                      }
                    }
                    else {
                      local_2b0 = (char *)0x40000000000;
                      pvVar2 = (iterator)0x2;
                      p_Var3 = &local_50;
                      boost::test_tools::tt_detail::
                      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                                (&local_90,&local_250,0x6c7,1,2,p_Var3,
                                 "ParseByteUnits(\"4T\", noop).value()",ppcVar6,"4ULL << 40");
                      local_260 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ;
                      local_258 = "";
                      local_270 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_268 = &boost::unit_test::basic_cstring<char_const>::null;
                      msg_09.m_end = (iterator)p_Var3;
                      msg_09.m_begin = pvVar2;
                      file_09.m_end = (iterator)0x6ca;
                      file_09.m_begin = (iterator)&local_260;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                                 (size_t)&local_270,msg_09);
                      local_90.m_empty = false;
                      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
                      local_80 = boost::unit_test::lazy_ostream::inst;
                      local_78 = (char **)0xc694e1;
                      local_280 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ;
                      local_278 = "";
                      str_09._M_str = "5";
                      str_09._M_len = 1;
                      oVar5 = ParseByteUnits(str_09,K);
                      local_50._M_value =
                           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._M_payload;
                      local_48._0_1_ =
                           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long>._M_engaged;
                      if (((undefined1  [16])
                           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                          (undefined1  [16])0x0) {
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          std::__throw_bad_optional_access();
                        }
                      }
                      else {
                        local_2b0 = (char *)0x1400;
                        pvVar2 = (iterator)0x2;
                        p_Var3 = &local_50;
                        boost::test_tools::tt_detail::
                        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                                  (&local_90,&local_280,0x6ca,1,2,p_Var3,
                                   "ParseByteUnits(\"5\", ByteUnit::K).value()",ppcVar6,"5ULL << 10"
                                  );
                        local_290 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_288 = "";
                        local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_298 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_10.m_end = (iterator)p_Var3;
                        msg_10.m_begin = pvVar2;
                        file_10.m_end = (iterator)0x6cd;
                        file_10.m_begin = (iterator)&local_290;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                                   (size_t)&local_2a0,msg_10);
                        oVar5 = ParseByteUnits((string_view)(ZEXT816(0xc694e1) << 0x40),NOOP);
                        local_50._M_value =
                             CONCAT71(local_50._M_value._1_7_,
                                      ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_48 = 0;
                        sStack_40.pi_ = (sp_counted_base *)0x0;
                        local_2b0 = "!ParseByteUnits(\"\", noop)";
                        local_2a8 = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = &local_2b0;
                        local_2c0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2b8 = "";
                        pvVar2 = &DAT_00000001;
                        pvVar4 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                   (check_type)ppcVar6,(size_t)&local_2c0,0x6cd);
                        boost::detail::shared_count::~shared_count(&sStack_40);
                        local_2d0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2c8 = "";
                        local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_11.m_end = pvVar4;
                        msg_11.m_begin = pvVar2;
                        file_11.m_end = (iterator)0x6ce;
                        file_11.m_begin = (iterator)&local_2d0;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                                   (size_t)&local_2e0,msg_11);
                        str_10._M_str = "foo";
                        str_10._M_len = 3;
                        oVar5 = ParseByteUnits(str_10,NOOP);
                        local_50._M_value =
                             CONCAT71(local_50._M_value._1_7_,
                                      ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_48 = 0;
                        sStack_40.pi_ = (sp_counted_base *)0x0;
                        local_2b0 = "!ParseByteUnits(\"foo\", noop)";
                        local_2a8 = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = &local_2b0;
                        local_2f0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2e8 = "";
                        pvVar2 = &DAT_00000001;
                        pvVar4 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                   (check_type)ppcVar6,(size_t)&local_2f0,0x6ce);
                        boost::detail::shared_count::~shared_count(&sStack_40);
                        local_300 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_2f8 = "";
                        local_310 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_308 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_12.m_end = pvVar4;
                        msg_12.m_begin = pvVar2;
                        file_12.m_end = (iterator)0x6d1;
                        file_12.m_begin = (iterator)&local_300;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                                   (size_t)&local_310,msg_12);
                        str_11._M_str = "123m ";
                        str_11._M_len = 5;
                        oVar5 = ParseByteUnits(str_11,NOOP);
                        local_50._M_value =
                             CONCAT71(local_50._M_value._1_7_,
                                      ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_48 = 0;
                        sStack_40.pi_ = (sp_counted_base *)0x0;
                        local_2b0 = "!ParseByteUnits(\"123m \", noop)";
                        local_2a8 = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = &local_2b0;
                        local_320 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_318 = "";
                        pvVar2 = &DAT_00000001;
                        pvVar4 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                   (check_type)ppcVar6,(size_t)&local_320,0x6d1);
                        boost::detail::shared_count::~shared_count(&sStack_40);
                        local_330 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_328 = "";
                        local_340 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_338 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_13.m_end = pvVar4;
                        msg_13.m_begin = pvVar2;
                        file_13.m_end = (iterator)0x6d2;
                        file_13.m_begin = (iterator)&local_330;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                                   (size_t)&local_340,msg_13);
                        str_12._M_str = " 123m";
                        str_12._M_len = 5;
                        oVar5 = ParseByteUnits(str_12,NOOP);
                        local_50._M_value =
                             CONCAT71(local_50._M_value._1_7_,
                                      ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_48 = 0;
                        sStack_40.pi_ = (sp_counted_base *)0x0;
                        local_2b0 = "!ParseByteUnits(\" 123m\", noop)";
                        local_2a8 = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = &local_2b0;
                        local_350 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_348 = "";
                        pvVar2 = &DAT_00000001;
                        pvVar4 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                   (check_type)ppcVar6,(size_t)&local_350,0x6d2);
                        boost::detail::shared_count::~shared_count(&sStack_40);
                        local_360 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_358 = "";
                        local_370 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_368 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_14.m_end = pvVar4;
                        msg_14.m_begin = pvVar2;
                        file_14.m_end = (iterator)0x6d5;
                        file_14.m_begin = (iterator)&local_360;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                                   (size_t)&local_370,msg_14);
                        str_13._M_str = "-123m";
                        str_13._M_len = 5;
                        oVar5 = ParseByteUnits(str_13,NOOP);
                        local_50._M_value =
                             CONCAT71(local_50._M_value._1_7_,
                                      ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_48 = 0;
                        sStack_40.pi_ = (sp_counted_base *)0x0;
                        local_2b0 = "!ParseByteUnits(\"-123m\", noop)";
                        local_2a8 = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = &local_2b0;
                        local_380 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_378 = "";
                        pvVar2 = &DAT_00000001;
                        pvVar4 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                   (check_type)ppcVar6,(size_t)&local_380,0x6d5);
                        boost::detail::shared_count::~shared_count(&sStack_40);
                        local_390 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_388 = "";
                        local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_398 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_15.m_end = pvVar4;
                        msg_15.m_begin = pvVar2;
                        file_15.m_end = (iterator)0x6d6;
                        file_15.m_begin = (iterator)&local_390;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                                   (size_t)&local_3a0,msg_15);
                        str_14._M_str = "+123m";
                        str_14._M_len = 5;
                        oVar5 = ParseByteUnits(str_14,NOOP);
                        local_50._M_value =
                             CONCAT71(local_50._M_value._1_7_,
                                      ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_long>.
                                       _M_engaged) & 0xffffffffffffff01;
                        local_48 = 0;
                        sStack_40.pi_ = (sp_counted_base *)0x0;
                        local_2b0 = "!ParseByteUnits(\"+123m\", noop)";
                        local_2a8 = "";
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_3b0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_3a8 = "";
                        pvVar2 = &DAT_00000001;
                        pvVar4 = (iterator)0x0;
                        local_78 = &local_2b0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                   (check_type)ppcVar6,(size_t)&local_3b0,0x6d6);
                        boost::detail::shared_count::~shared_count(&sStack_40);
                        local_3c0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_3b8 = "";
                        local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_16.m_end = pvVar4;
                        msg_16.m_begin = pvVar2;
                        file_16.m_end = (iterator)0x6d9;
                        file_16.m_begin = (iterator)&local_3c0;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                                   (size_t)&local_3d0,msg_16);
                        local_90.m_empty = false;
                        local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
                        local_80 = boost::unit_test::lazy_ostream::inst;
                        local_78 = (char **)0xc694e1;
                        local_3e0 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                        ;
                        local_3d8 = "";
                        str_15._M_str = "020M";
                        str_15._M_len = 4;
                        oVar5 = ParseByteUnits(str_15,NOOP);
                        local_50._M_value =
                             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_long>._M_payload;
                        bVar1 = oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                                super__Optional_payload_base<unsigned_long>._M_engaged;
                        local_48._0_1_ = bVar1;
                        if (((undefined1  [16])
                             oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            std::__throw_bad_optional_access();
                          }
                        }
                        else {
                          local_2b0 = (char *)0x1400000;
                          pvVar2 = (iterator)0x2;
                          p_Var3 = &local_50;
                          ppcVar6 = &local_2b0;
                          boost::test_tools::tt_detail::
                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
                                    (&local_90,&local_3e0,0x6d9,1,2,p_Var3,
                                     "ParseByteUnits(\"020M\", noop).value()",&local_2b0,
                                     "20ULL << 20");
                          local_3f0 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_3e8 = "";
                          local_400 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
                          msg_17.m_end = (iterator)p_Var3;
                          msg_17.m_begin = pvVar2;
                          file_17.m_end = (iterator)0x6dc;
                          file_17.m_begin = (iterator)&local_3f0;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                                     (size_t)&local_400,msg_17);
                          str_16._M_str = "0.5T";
                          str_16._M_len = 4;
                          oVar5 = ParseByteUnits(str_16,NOOP);
                          local_50._M_value =
                               CONCAT71(local_50._M_value._1_7_,
                                        ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                         _M_payload.super__Optional_payload_base<unsigned_long>.
                                         _M_engaged) & 0xffffffffffffff01;
                          local_48 = 0;
                          sStack_40.pi_ = (sp_counted_base *)0x0;
                          local_2b0 = "!ParseByteUnits(\"0.5T\", noop)";
                          local_2a8 = "";
                          local_90.m_empty = false;
                          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                          local_80 = boost::unit_test::lazy_ostream::inst;
                          local_410 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_408 = "";
                          pvVar2 = &DAT_00000001;
                          pvVar4 = (iterator)0x0;
                          local_78 = &local_2b0;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                     (check_type)ppcVar6,(size_t)&local_410,0x6dc);
                          boost::detail::shared_count::~shared_count(&sStack_40);
                          local_420 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_418 = "";
                          local_430 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_428 = &boost::unit_test::basic_cstring<char_const>::null;
                          msg_18.m_end = pvVar4;
                          msg_18.m_begin = pvVar2;
                          file_18.m_end = (iterator)0x6df;
                          file_18.m_begin = (iterator)&local_420;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                                     (size_t)&local_430,msg_18);
                          str_17._M_str = "18446744073709551615g";
                          str_17._M_len = 0x15;
                          oVar5 = ParseByteUnits(str_17,NOOP);
                          local_50._M_value =
                               CONCAT71(local_50._M_value._1_7_,
                                        ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                         _M_payload.super__Optional_payload_base<unsigned_long>.
                                         _M_engaged) & 0xffffffffffffff01;
                          local_48 = 0;
                          sStack_40.pi_ = (sp_counted_base *)0x0;
                          local_2b0 = "!ParseByteUnits(\"18446744073709551615g\", noop)";
                          local_2a8 = "";
                          local_90.m_empty = false;
                          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                          local_80 = boost::unit_test::lazy_ostream::inst;
                          local_78 = &local_2b0;
                          local_440 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_438 = "";
                          pvVar2 = &DAT_00000001;
                          pvVar4 = (iterator)0x0;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                     (check_type)ppcVar6,(size_t)&local_440,0x6df);
                          boost::detail::shared_count::~shared_count(&sStack_40);
                          local_450 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_448 = "";
                          local_460 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_458 = &boost::unit_test::basic_cstring<char_const>::null;
                          msg_19.m_end = pvVar4;
                          msg_19.m_begin = pvVar2;
                          file_19.m_end = (iterator)0x6e2;
                          file_19.m_begin = (iterator)&local_450;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                                     (size_t)&local_460,msg_19);
                          str_18._M_str = "1x";
                          str_18._M_len = 2;
                          oVar5 = ParseByteUnits(str_18,NOOP);
                          local_50._M_value =
                               CONCAT71(local_50._M_value._1_7_,
                                        ~oVar5.super__Optional_base<unsigned_long,_true,_true>.
                                         _M_payload.super__Optional_payload_base<unsigned_long>.
                                         _M_engaged) & 0xffffffffffffff01;
                          local_48._0_1_ = 0;
                          local_48._1_7_ = 0;
                          sStack_40.pi_ = (sp_counted_base *)0x0;
                          local_2b0 = "!ParseByteUnits(\"1x\", noop)";
                          local_2a8 = "";
                          local_90.m_empty = false;
                          local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
                          local_80 = boost::unit_test::lazy_ostream::inst;
                          local_78 = &local_2b0;
                          local_470 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                          ;
                          local_468 = "";
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)&local_50,&local_90,1,0,WARN,
                                     (check_type)ppcVar6,(size_t)&local_470,0x6e2);
                          boost::detail::shared_count::~shared_count(&sStack_40);
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ParseByteUnits)
{
    auto noop = ByteUnit::NOOP;

    // no multiplier
    BOOST_CHECK_EQUAL(ParseByteUnits("1", noop).value(), 1);
    BOOST_CHECK_EQUAL(ParseByteUnits("0", noop).value(), 0);

    BOOST_CHECK_EQUAL(ParseByteUnits("1k", noop).value(), 1000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("1K", noop).value(), 1ULL << 10);

    BOOST_CHECK_EQUAL(ParseByteUnits("2m", noop).value(), 2'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("2M", noop).value(), 2ULL << 20);

    BOOST_CHECK_EQUAL(ParseByteUnits("3g", noop).value(), 3'000'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("3G", noop).value(), 3ULL << 30);

    BOOST_CHECK_EQUAL(ParseByteUnits("4t", noop).value(), 4'000'000'000'000ULL);
    BOOST_CHECK_EQUAL(ParseByteUnits("4T", noop).value(), 4ULL << 40);

    // check default multiplier
    BOOST_CHECK_EQUAL(ParseByteUnits("5", ByteUnit::K).value(), 5ULL << 10);

    // NaN
    BOOST_CHECK(!ParseByteUnits("", noop));
    BOOST_CHECK(!ParseByteUnits("foo", noop));

    // whitespace
    BOOST_CHECK(!ParseByteUnits("123m ", noop));
    BOOST_CHECK(!ParseByteUnits(" 123m", noop));

    // no +-
    BOOST_CHECK(!ParseByteUnits("-123m", noop));
    BOOST_CHECK(!ParseByteUnits("+123m", noop));

    // zero padding
    BOOST_CHECK_EQUAL(ParseByteUnits("020M", noop).value(), 20ULL << 20);

    // fractions not allowed
    BOOST_CHECK(!ParseByteUnits("0.5T", noop));

    // overflow
    BOOST_CHECK(!ParseByteUnits("18446744073709551615g", noop));

    // invalid unit
    BOOST_CHECK(!ParseByteUnits("1x", noop));
}